

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QPodArrayOps<long_long>::emplace<long_long&>
          (QPodArrayOps<long_long> *this,qsizetype i,longlong *args)

{
  qsizetype *pqVar1;
  Data *pDVar2;
  longlong lVar3;
  qsizetype qVar4;
  longlong *plVar5;
  GrowthPosition where;
  
  pDVar2 = (this->super_QArrayDataPointer<long_long>).d;
  if ((pDVar2 != (Data *)0x0) &&
     ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if (((this->super_QArrayDataPointer<long_long>).size == i) &&
       (qVar4 = QArrayDataPointer<long_long>::freeSpaceAtEnd
                          (&this->super_QArrayDataPointer<long_long>), qVar4 != 0)) {
      (this->super_QArrayDataPointer<long_long>).ptr
      [(this->super_QArrayDataPointer<long_long>).size] = *args;
    }
    else {
      if ((i != 0) ||
         (qVar4 = QArrayDataPointer<long_long>::freeSpaceAtBegin
                            (&this->super_QArrayDataPointer<long_long>), qVar4 == 0))
      goto LAB_004a771f;
      plVar5 = (this->super_QArrayDataPointer<long_long>).ptr;
      plVar5[-1] = *args;
      (this->super_QArrayDataPointer<long_long>).ptr = plVar5 + -1;
    }
    pqVar1 = &(this->super_QArrayDataPointer<long_long>).size;
    *pqVar1 = *pqVar1 + 1;
    return;
  }
LAB_004a771f:
  lVar3 = *args;
  where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<long_long>).size != 0);
  QArrayDataPointer<long_long>::detachAndGrow
            (&this->super_QArrayDataPointer<long_long>,where,1,(longlong **)0x0,
             (QArrayDataPointer<long_long> *)0x0);
  plVar5 = createHole(this,where,i,1);
  *plVar5 = lVar3;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }